

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_innerproduct_batchnorm(NetOptimize *this)

{
  float fVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  pointer pMVar11;
  size_type sVar12;
  long lVar13;
  ulong uVar14;
  int j;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  ulong local_c0;
  Mat local_b8;
  Layer *local_68;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  
  pvVar2 = (this->super_ModelWriter).layers;
  uVar16 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_c0 = 1;
  uVar19 = 0;
  do {
    if (uVar19 == uVar16) {
      return 0;
    }
    bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar19]->type,"InnerProduct");
    if (!bVar8) {
      iVar10 = *((((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar19]->tops).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (uVar17 = local_c0; uVar17 < uVar16; uVar17 = uVar17 + 1) {
        bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar17]->type,"BatchNorm")
        ;
        if (((!bVar8) &&
            (pLVar3 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar17],
            piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar4 == 4)) && (*piVar4 == iVar10)) {
          if (uVar16 != uVar17) {
            ppLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_68 = ppLVar5[uVar19];
            pLVar3 = ppLVar5[uVar17];
            fprintf(_stderr,"fuse_innerproduct_batchnorm %s %s\n",(local_68->name)._M_dataplus._M_p)
            ;
            uVar9 = *(uint *)&pLVar3[1]._vptr_Layer;
            fVar1 = *(float *)((long)&pLVar3[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&a,(long)(int)uVar9,(allocator_type *)&local_b8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&b,(long)(int)uVar9,(allocator_type *)&local_b8);
            uVar17 = 0;
            if (0 < (int)uVar9) {
              uVar17 = (ulong)uVar9;
            }
            for (uVar18 = 0; pLVar6 = local_68, uVar17 != uVar18; uVar18 = uVar18 + 1) {
              fVar20 = (float)pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[uVar18] + fVar1;
              if (fVar20 < 0.0) {
                fVar20 = sqrtf(fVar20);
              }
              else {
                fVar20 = SQRT(fVar20);
              }
              lVar13 = *(long *)&pLVar3[1].one_blob_only;
              a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar18] =
                   *(float *)(*(long *)&pLVar3[2].support_tensor_storage + uVar18 * 4) -
                   (*(float *)(lVar13 + uVar18 * 4) *
                   *(float *)(pLVar3[1].name._M_dataplus._M_p + uVar18 * 4)) / fVar20;
              b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar18] = *(float *)(lVar13 + uVar18 * 4) / fVar20;
            }
            if (*(int *)((long)&local_68[1]._vptr_Layer + 4) == 0) {
              *(undefined4 *)((long)&local_68[1]._vptr_Layer + 4) = 1;
              local_b8.cstep = 0;
              local_b8.data = (pointer)0x0;
              local_b8.refcount._0_4_ = 0;
              local_b8.refcount._4_4_ = 0;
              local_b8.elemsize._0_4_ = 0;
              local_b8.elemsize._4_4_ = 0;
              local_b8.elempack = 0;
              local_b8.h = 0;
              local_b8.d = 0;
              local_b8.c = 0;
              local_b8.allocator = (Allocator *)0x0;
              local_b8.dims = 0;
              local_b8.w = 0;
              ncnn::Mat::create(&local_b8,uVar9,4,(Allocator *)0x0);
              pMVar11 = (pointer)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
              if ((Mat *)&pLVar6[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish != &local_b8) {
                if (pMVar11 != (pointer)0x0) {
                  LOCK();
                  *(int *)&pMVar11->data = *(int *)&pMVar11->data + 1;
                  UNLOCK();
                }
                pMVar11 = pLVar6[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                if (pMVar11 != (pointer)0x0) {
                  LOCK();
                  *(int *)&pMVar11->data = *(int *)&pMVar11->data + -1;
                  UNLOCK();
                  if (*(int *)&pMVar11->data == 0) {
                    pMVar11 = pLVar6[1].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
                    if (pMVar11 == (pointer)0x0) {
                      free(pLVar6[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish);
                    }
                    else {
                      (**(code **)((long)pMVar11->data + 0x18))();
                    }
                  }
                }
                uVar7 = local_b8._52_8_;
                pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8.data;
                pMVar11 = (pointer)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
                pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar11;
                *(ulong *)&pLVar6[1].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data =
                     CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
                *(int *)&pLVar6[1].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_b8.elempack;
                pLVar6[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.allocator;
                *(int *)&pLVar6[2]._vptr_Layer = local_b8.dims;
                *(int *)((long)&pLVar6[2]._vptr_Layer + 4) = local_b8.w;
                pLVar6[2].one_blob_only = (bool)(undefined1)local_b8.h;
                pLVar6[2].support_inplace = (bool)local_b8.h._1_1_;
                pLVar6[2].support_vulkan = (bool)local_b8.h._2_1_;
                pLVar6[2].support_packing = (bool)local_b8.h._3_1_;
                pLVar6[2].support_bf16_storage = (bool)(undefined1)local_b8.d;
                pLVar6[2].support_fp16_storage = (bool)local_b8.d._1_1_;
                pLVar6[2].support_int8_storage = (bool)local_b8.d._2_1_;
                pLVar6[2].support_image_storage = (bool)local_b8.d._3_1_;
                local_b8.c = SUB84(uVar7,4);
                pLVar6[2].support_tensor_storage = (bool)(undefined1)local_b8.c;
                pLVar6[2].support_reserved_00 = (bool)local_b8.c._1_1_;
                pLVar6[2].support_reserved_0 = (bool)local_b8.c._2_1_;
                pLVar6[2].support_reserved_1 = (bool)local_b8.c._3_1_;
                pLVar6[2].support_reserved_6 = (bool)(undefined1)local_b8.cstep;
                pLVar6[2].support_reserved_7 = (bool)local_b8.cstep._1_1_;
                pLVar6[2].support_reserved_8 = (bool)local_b8.cstep._2_1_;
                pLVar6[2].support_reserved_9 = (bool)local_b8.cstep._3_1_;
                pLVar6[2].support_reserved_10 = (bool)local_b8.cstep._4_1_;
                pLVar6[2].support_reserved_11 = (bool)local_b8.cstep._5_1_;
                pLVar6[2].support_reserved_12 = (bool)local_b8.cstep._6_1_;
                pLVar6[2].support_reserved_13 = (bool)local_b8.cstep._7_1_;
                local_b8._52_8_ = uVar7;
              }
              if (pMVar11 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar11->data = *(int *)&pMVar11->data + -1;
                UNLOCK();
                if (*(int *)&pMVar11->data == 0) {
                  if ((pointer)local_b8.allocator == (pointer)0x0) {
                    free(local_b8.data);
                  }
                  else {
                    (**(code **)((long)(local_b8.allocator)->_vptr_Allocator + 0x18))();
                  }
                }
              }
              iVar10 = *(int *)&pLVar6[2].support_tensor_storage *
                       *(int *)&pLVar6[2].support_reserved_6;
              pMVar11 = pLVar6[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (iVar10 < 1) {
                iVar10 = 0;
              }
              for (lVar13 = 0; iVar10 != (int)lVar13; lVar13 = lVar13 + 1) {
                *(undefined4 *)((long)&pMVar11->data + lVar13 * 4) = 0;
              }
            }
            else {
              pMVar11 = local_68[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            uVar9 = *(int *)&pLVar6[1].one_blob_only / (int)uVar9;
            sVar12 = pLVar6[1].name.field_2._M_allocated_capacity;
            uVar18 = 0;
            if (0 < (int)uVar9) {
              uVar18 = (ulong)uVar9;
            }
            for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
              for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
                *(float *)(sVar12 + uVar15 * 4) =
                     b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14] * *(float *)(sVar12 + uVar15 * 4);
              }
              *(float *)((long)&pMVar11->data + uVar14 * 4) =
                   *(float *)((long)&pMVar11->data + uVar14 * 4) *
                   b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14] +
                   a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
              sVar12 = sVar12 + (long)(int)uVar9 * 4;
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&b.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&a.super__Vector_base<float,_std::allocator<float>_>);
            iVar10 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar10;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar10].producer = (int)uVar19;
            std::__cxx11::string::assign((char *)&pLVar3->type);
          }
          break;
        }
      }
    }
    uVar19 = uVar19 + 1;
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - BatchNorm to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_innerproduct_batchnorm %s %s\n", innerproduct->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (innerproduct->bias_term == 0)
            {
                // init bias as zero
                innerproduct->bias_term = 1;
                innerproduct->bias_data = ncnn::Mat(channels);
                innerproduct->bias_data.fill(0.f);
            }

            const int weight_per_outch = innerproduct->weight_data_size / channels;

            float* weight = innerproduct->weight_data;
            float* bias = innerproduct->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}